

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_Realloc_Test::TestBody(TCMallocTest_Realloc_Test *this)

{
  undefined8 uVar1;
  char cVar2;
  TestingPortal *pTVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  pointer pcVar7;
  pointer *__ptr;
  long lVar8;
  long lVar9;
  size_t __size;
  code *local_60;
  void *p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  void *new_p;
  code *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pTVar3 = tcmalloc::TestingPortal::Get();
  cVar2 = (**(code **)(*(long *)pTVar3 + 8))(pTVar3);
  if (cVar2 == '\0') {
    pTVar3 = tcmalloc::TestingPortal::Get();
    puVar4 = (undefined8 *)(**(code **)(*(long *)pTVar3 + 0x28))(pTVar3);
    uVar1 = *puVar4;
    *puVar4 = 0;
    lVar9 = 8;
    lVar6 = 0;
    lVar5 = 0;
    do {
      __size = (size_t)(int)(&DAT_00149050)[lVar5];
      local_40 = (code *)malloc(__size);
      (*noopt_helper)((internal *)&local_40);
      local_60 = local_40;
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                ((internal *)&local_40,"p","nullptr",&local_60,&local_50._M_head_impl);
      if (local_40._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_38->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&new_p,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x2d1,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&new_p,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&new_p);
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
joined_r0x0010e0cd:
        if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_38,local_38);
        }
        break;
      }
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_38,local_38);
      }
      lVar8 = 0;
      do {
        local_40 = realloc;
        (*noopt_helper)((internal *)&local_40);
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*local_40)(local_60,(long)*(int *)((long)&DAT_0014a3b0 + lVar8) + __size);
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_40,"p","new_p",&local_60,&local_50._M_head_impl);
        if (local_40._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&new_p);
          if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = "";
          }
          else {
            pcVar7 = (local_38->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&p,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x2d5,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&p,(Message *)&new_p);
          goto LAB_0010e025;
        }
        if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_38,local_38);
        }
        lVar8 = lVar8 + 4;
      } while (lVar9 != lVar8);
      if (lVar5 != 0) {
        lVar8 = 0;
LAB_0010deed:
        local_40 = realloc;
        (*noopt_helper)((internal *)&local_40);
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*local_40)(local_60,__size - (long)*(int *)((long)&DAT_0014a3b0 + lVar8));
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_40,"p","new_p",&local_60,&local_50._M_head_impl);
        if (local_40._0_1_ != (internal)0x0) goto code_r0x0010df48;
        testing::Message::Message((Message *)&new_p);
        if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_38->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&p,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x2da,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&p,(Message *)&new_p);
LAB_0010e025:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
        if (new_p != (void *)0x0) {
          (**(code **)(*new_p + 8))();
        }
        goto joined_r0x0010e0cd;
      }
LAB_0010df63:
      free(local_60);
      lVar5 = lVar5 + 1;
      lVar9 = lVar9 + 8;
      lVar6 = lVar6 + 2;
    } while (lVar5 != 4);
    *puVar4 = uVar1;
  }
  return;
code_r0x0010df48:
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  lVar8 = lVar8 + 4;
  if ((lVar6 + (ulong)(lVar6 == 0)) * 4 == lVar8) goto LAB_0010df63;
  goto LAB_0010deed;
}

Assistant:

TEST(TCMallocTest, Realloc) {
  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    // debug alloc doesn't try to minimize reallocs
    return;
  }
  // When sampling, we always allocate in units of page-size, which
  // makes reallocs of small sizes do extra work (thus, failing these
  // checks).  Since sampling is random, we turn off sampling to make
  // sure that doesn't happen to us here.

  // turn off sampling
  tcmalloc::Cleanup cleanup = SetFlag(&TestingPortal::Get()->GetSampleParameter(), 0);

  int start_sizes[] = { 100, 1000, 10000, 100000 };
  int deltas[] = { 1, -2, 4, -8, 16, -32, 64, -128 };

  for (int s = 0; s < sizeof(start_sizes)/sizeof(*start_sizes); ++s) {
    void* p = noopt(malloc(start_sizes[s]));
    ASSERT_NE(p, nullptr);
    // The larger the start-size, the larger the non-reallocing delta.
    for (int d = 0; d < (s+1) * 2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] + deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    // Test again, but this time reallocing smaller first.
    for (int d = 0; d < s*2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] - deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    free(p);
  }
}